

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5MultiIterNew(Fts5Index *p,Fts5Structure *pStruct,int flags,Fts5Colset *pColset,u8 *pTerm,
                     int nTerm,int iLevel,int nSegment,Fts5Iter **ppOut)

{
  Fts5Iter *pTerm_00;
  Fts5Index *pFVar1;
  Fts5Index *p_00;
  Fts5Colset *in_RCX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int in_stack_00000008;
  Fts5SegIter *pIter_1;
  Fts5StructureSegment *pSeg;
  Fts5SegIter *pIter;
  Fts5StructureLevel *pEnd;
  Fts5Iter *pNew;
  Fts5StructureLevel *pLvl;
  int iSeg;
  int iIter;
  int nSeg;
  Fts5Iter *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  uint uVar2;
  Fts5Iter *in_stack_ffffffffffffff98;
  Fts5Index *in_stack_ffffffffffffffa0;
  Fts5StructureSegment *in_stack_ffffffffffffffa8;
  int local_38;
  int local_34;
  int local_30;
  
  local_30 = 0;
  local_34 = 0;
  if (*(int *)(in_RDI + 0x3c) == 0) {
    if (in_stack_00000008 < 0) {
      uVar2 = in_stack_ffffffffffffff94 & 0xffffff;
      if (*(long *)(in_RDI + 0x18) != 0) {
        uVar2 = CONCAT13((in_EDX & 0x40) == 0,(int3)in_stack_ffffffffffffff94);
      }
      local_30 = (uVar2 >> 0x18) + *(int *)(in_RSI + 0x18);
      in_stack_ffffffffffffff94 = uVar2;
    }
    else {
      in_stack_ffffffffffffff90 = (int)pIter_1;
      local_30 = (int)pIter_1;
      if (*(int *)(in_RSI + (long)in_stack_00000008 * 0x10 + 0x24) < (int)pIter_1) {
        in_stack_ffffffffffffff90 = *(int *)(in_RSI + (long)in_stack_00000008 * 0x10 + 0x24);
        local_30 = in_stack_ffffffffffffff90;
      }
    }
  }
  pTerm_00 = fts5MultiIterAlloc(in_stack_ffffffffffffffa0,
                                (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  *(Fts5Iter **)pSeg = pTerm_00;
  if (pTerm_00 != (Fts5Iter *)0x0) {
    pTerm_00->bRev = (uint)((in_EDX & 2) != 0);
    pTerm_00->bSkipEmpty = (in_EDX & 0x10) != 0;
    pTerm_00->pColset = in_RCX;
    if ((in_EDX & 0x20) == 0) {
      fts5IterSetOutputCb((int *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          in_stack_ffffffffffffff88);
    }
    if (*(int *)(in_RDI + 0x3c) == 0) {
      local_38 = local_30;
      if (in_stack_00000008 < 0) {
        pFVar1 = (Fts5Index *)(in_RSI + 0x20 + (long)*(int *)(in_RSI + 0x1c) * 0x10);
        if ((*(long *)(in_RDI + 0x18) != 0) && ((in_EDX & 0x40) == 0)) {
          in_stack_ffffffffffffffa8 = (Fts5StructureSegment *)pTerm_00->aSeg;
          local_34 = 1;
          fts5SegIterHashInit(in_stack_ffffffffffffffa0,(u8 *)in_stack_ffffffffffffff98,
                              in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,
                              (Fts5SegIter *)in_stack_ffffffffffffff88);
        }
        for (p_00 = (Fts5Index *)(in_RSI + 0x20); p_00 < pFVar1;
            p_00 = (Fts5Index *)&p_00->nWorkUnit) {
          local_38 = *(int *)((long)&p_00->pConfig + 4);
          while (local_38 = local_38 + -1, -1 < local_38) {
            in_stack_ffffffffffffffa0 = (Fts5Index *)(p_00->zDataTbl + (long)local_38 * 0x38);
            in_stack_ffffffffffffff98 = (Fts5Iter *)(pTerm_00->aSeg + local_34);
            if (in_R8 == 0) {
              fts5SegIterInit(in_stack_ffffffffffffffa0,
                              (Fts5StructureSegment *)in_stack_ffffffffffffff98,
                              (Fts5SegIter *)
                              CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
              local_34 = local_34 + 1;
            }
            else {
              fts5SegIterSeekInit(p_00,(u8 *)pTerm_00,(int)((ulong)pFVar1 >> 0x20),(int)pFVar1,
                                  in_stack_ffffffffffffffa8,(Fts5SegIter *)in_stack_ffffffffffffffa0
                                 );
              local_34 = local_34 + 1;
            }
          }
        }
      }
      else {
        while (local_38 = local_38 + -1, -1 < local_38) {
          fts5SegIterInit(in_stack_ffffffffffffffa0,
                          (Fts5StructureSegment *)in_stack_ffffffffffffff98,
                          (Fts5SegIter *)
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        }
      }
    }
    if (*(int *)(in_RDI + 0x3c) == 0) {
      fts5MultiIterFinishSetup(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    else {
      fts5MultiIterFree((Fts5Iter *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      pSeg->iSegid = 0;
      pSeg->pgnoFirst = 0;
    }
  }
  return;
}

Assistant:

static void fts5MultiIterNew(
  Fts5Index *p,                   /* FTS5 backend to iterate within */
  Fts5Structure *pStruct,         /* Structure of specific index */
  int flags,                      /* FTS5INDEX_QUERY_XXX flags */
  Fts5Colset *pColset,            /* Colset to filter on (or NULL) */
  const u8 *pTerm, int nTerm,     /* Term to seek to (or NULL/0) */
  int iLevel,                     /* Level to iterate (-1 for all) */
  int nSegment,                   /* Number of segments to merge (iLevel>=0) */
  Fts5Iter **ppOut                /* New object */
){
  int nSeg = 0;                   /* Number of segment-iters in use */
  int iIter = 0;                  /* */
  int iSeg;                       /* Used to iterate through segments */
  Fts5StructureLevel *pLvl;
  Fts5Iter *pNew;

  assert( (pTerm==0 && nTerm==0) || iLevel<0 );

  /* Allocate space for the new multi-seg-iterator. */
  if( p->rc==SQLITE_OK ){
    if( iLevel<0 ){
      assert( pStruct->nSegment==fts5StructureCountSegments(pStruct) );
      nSeg = pStruct->nSegment;
      nSeg += (p->pHash && 0==(flags & FTS5INDEX_QUERY_SKIPHASH));
    }else{
      nSeg = MIN(pStruct->aLevel[iLevel].nSeg, nSegment);
    }
  }
  *ppOut = pNew = fts5MultiIterAlloc(p, nSeg);
  if( pNew==0 ){
    assert( p->rc!=SQLITE_OK );
    goto fts5MultiIterNew_post_check;
  }
  pNew->bRev = (0!=(flags & FTS5INDEX_QUERY_DESC));
  pNew->bSkipEmpty = (0!=(flags & FTS5INDEX_QUERY_SKIPEMPTY));
  pNew->pColset = pColset;
  if( (flags & FTS5INDEX_QUERY_NOOUTPUT)==0 ){
    fts5IterSetOutputCb(&p->rc, pNew);
  }

  /* Initialize each of the component segment iterators. */
  if( p->rc==SQLITE_OK ){
    if( iLevel<0 ){
      Fts5StructureLevel *pEnd = &pStruct->aLevel[pStruct->nLevel];
      if( p->pHash && 0==(flags & FTS5INDEX_QUERY_SKIPHASH) ){
        /* Add a segment iterator for the current contents of the hash table. */
        Fts5SegIter *pIter = &pNew->aSeg[iIter++];
        fts5SegIterHashInit(p, pTerm, nTerm, flags, pIter);
      }
      for(pLvl=&pStruct->aLevel[0]; pLvl<pEnd; pLvl++){
        for(iSeg=pLvl->nSeg-1; iSeg>=0; iSeg--){
          Fts5StructureSegment *pSeg = &pLvl->aSeg[iSeg];
          Fts5SegIter *pIter = &pNew->aSeg[iIter++];
          if( pTerm==0 ){
            fts5SegIterInit(p, pSeg, pIter);
          }else{
            fts5SegIterSeekInit(p, pTerm, nTerm, flags, pSeg, pIter);
          }
        }
      }
    }else{
      pLvl = &pStruct->aLevel[iLevel];
      for(iSeg=nSeg-1; iSeg>=0; iSeg--){
        fts5SegIterInit(p, &pLvl->aSeg[iSeg], &pNew->aSeg[iIter++]);
      }
    }
    assert( iIter==nSeg );
  }

  /* If the above was successful, each component iterator now points
  ** to the first entry in its segment. In this case initialize the
  ** aFirst[] array. Or, if an error has occurred, free the iterator
  ** object and set the output variable to NULL.  */
  if( p->rc==SQLITE_OK ){
    fts5MultiIterFinishSetup(p, pNew);
  }else{
    fts5MultiIterFree(pNew);
    *ppOut = 0;
  }

fts5MultiIterNew_post_check:
  assert( (*ppOut)!=0 || p->rc!=SQLITE_OK );
  return;
}